

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O1

string * __thiscall
yactfr::internal::DsPktProc::toStr_abi_cxx11_
          (string *__return_storage_ptr__,DsPktProc *this,Size indent)

{
  internal *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  DsPktProc *pDVar3;
  string *psVar4;
  ostream *poVar5;
  Size indent_00;
  Size extraout_RDX;
  Size extraout_RDX_00;
  Size extraout_RDX_01;
  Size extraout_RDX_02;
  Size extraout_RDX_03;
  Size extraout_RDX_04;
  Size extraout_RDX_05;
  Size extraout_RDX_06;
  Size extraout_RDX_07;
  Size extraout_RDX_08;
  Size extraout_RDX_09;
  Size extraout_RDX_10;
  Size SVar6;
  unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> *erProcUp;
  pointer puVar7;
  _Hash_node_base *p_Var8;
  Size indent_01;
  string rProp_1;
  string rProp;
  ostringstream ss;
  string local_298;
  DsPktProc *local_278;
  char *local_270;
  long local_268;
  char local_260;
  undefined7 uStack_25f;
  char *local_250;
  long local_248;
  char local_240;
  undefined7 uStack_23f;
  long *local_230 [2];
  long local_220 [2];
  string *local_210;
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  indent_abi_cxx11_(&local_298,(internal *)indent,indent_00);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DS packet proc","");
  anon_unknown_8::_strTopName(&local_1c8,&local_1e8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"dst-id","");
  local_248 = 0;
  local_240 = '\0';
  local_250 = &local_240;
  std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)0x0,0x2abc22);
  std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_230[0]);
  std::__cxx11::string::append((char *)&local_250);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_250,local_248);
  poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  local_278 = this;
  local_210 = __return_storage_ptr__;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"er-align","");
  local_268 = 0;
  local_260 = '\0';
  local_270 = &local_260;
  std::__cxx11::string::_M_replace((ulong)&local_270,0,(char *)0x0,0x2abc22);
  std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_208[0]);
  std::__cxx11::string::append((char *)&local_270);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_270,local_268);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  SVar6 = extraout_RDX;
  if (local_270 != &local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
    SVar6 = extraout_RDX_00;
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
    SVar6 = extraout_RDX_01;
  }
  pDVar3 = local_278;
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
    SVar6 = extraout_RDX_02;
  }
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
    SVar6 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    SVar6 = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    SVar6 = extraout_RDX_05;
  }
  paVar1 = &local_298.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    SVar6 = extraout_RDX_06;
  }
  this_00 = (internal *)(indent + 1);
  indent_abi_cxx11_(&local_298,this_00,SVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<pkt preamble proc>",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  indent_01 = indent + 2;
  Proc::toStr_abi_cxx11_(&local_298,&pDVar3->_pktPreambleProc,indent_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  SVar6 = extraout_RDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    SVar6 = extraout_RDX_08;
  }
  indent_abi_cxx11_(&local_298,this_00,SVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<ER preamble proc>",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  Proc::toStr_abi_cxx11_(&local_298,&pDVar3->_erPreambleProc,indent_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
  SVar6 = extraout_RDX_09;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    SVar6 = extraout_RDX_10;
  }
  if (((long)(pDVar3->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pDVar3->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) +
      (pDVar3->_erProcsMap)._M_h._M_element_count != 0) {
    indent_abi_cxx11_(&local_298,this_00,SVar6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<ER procs>",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    puVar7 = (pDVar3->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pDVar3->_erProcsVec).
             super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != puVar2) {
      do {
        if ((puVar7->_M_t).
            super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
            ._M_t.
            super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
            .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl != (ErProc *)0x0)
        {
          ErProc::toStr_abi_cxx11_
                    (&local_298,
                     (puVar7->_M_t).
                     super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
                     .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl,
                     indent_01);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != paVar1) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
    p_Var8 = (local_278->_erProcsMap)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      do {
        ErProc::toStr_abi_cxx11_(&local_298,(ErProc *)p_Var8[2]._M_nxt,indent_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_298._M_dataplus._M_p,local_298._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar1) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
    }
  }
  psVar4 = local_210;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string DsPktProc::toStr(const Size indent) const
{
    std::ostringstream ss;

    ss << internal::indent(indent) << _strTopName("DS packet proc") <<
          " " << _strProp("dst-id") << _dst->id() <<
          " " << _strProp("er-align") << _erAlign << std::endl;
    ss << internal::indent(indent + 1) << "<pkt preamble proc>" << std::endl;
    ss << _pktPreambleProc.toStr(indent + 2);
    ss << internal::indent(indent + 1) << "<ER preamble proc>" << std::endl;
    ss << _erPreambleProc.toStr(indent + 2);

    if (this->erProcsCount() > 0) {
        ss << internal::indent(indent + 1) << "<ER procs>" << std::endl;

        for (const auto& erProcUp : _erProcsVec) {
            if (erProcUp) {
                ss << erProcUp->toStr(indent + 2);
            }
        }

        for (const auto& idErProcUpPair : _erProcsMap) {
            ss << idErProcUpPair.second->toStr(indent + 2);
        }
    }

    return ss.str();
}